

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O2

int gladLoadGLES1Loader(GLADloadproc load)

{
  char *__s;
  int iVar1;
  undefined8 in_RAX;
  GLubyte *pGVar2;
  size_t __n;
  uint uVar3;
  long lVar4;
  int minor;
  int major;
  undefined8 local_38;
  
  GLVersion.major = 0;
  GLVersion.minor = 0;
  local_38 = in_RAX;
  glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
  uVar3 = 0;
  if ((glad_glGetString != (PFNGLGETSTRINGPROC)0x0) &&
     (pGVar2 = (*glad_glGetString)(0x1f02), pGVar2 != (GLubyte *)0x0)) {
    pGVar2 = (*glad_glGetString)(0x1f02);
    if (pGVar2 != (GLubyte *)0x0) {
      lVar4 = 0;
      do {
        if (lVar4 == 0x18) goto LAB_0011d228;
        __s = *(char **)((long)&PTR_anon_var_dwarf_1dc12_0016a530 + lVar4);
        __n = strlen(__s);
        iVar1 = strncmp((char *)pGVar2,__s,__n);
        lVar4 = lVar4 + 8;
      } while (iVar1 != 0);
      pGVar2 = pGVar2 + __n;
LAB_0011d228:
      __isoc99_sscanf(pGVar2,"%d.%d",(long)&local_38 + 4,&local_38);
      GLVersion.minor = (int)local_38;
      GLVersion.major = local_38._4_4_;
      GLAD_GL_VERSION_ES_CM_1_0 =
           (int)(1 < local_38._4_4_ || -1 < (int)local_38 && local_38._4_4_ == 1);
    }
    if (GLAD_GL_VERSION_ES_CM_1_0 != 0) {
      glad_glAlphaFunc = (PFNGLALPHAFUNCPROC)(*load)("glAlphaFunc");
      glad_glClearColor = (PFNGLCLEARCOLORPROC)(*load)("glClearColor");
      glad_glClearDepthf = (PFNGLCLEARDEPTHFPROC)(*load)("glClearDepthf");
      glad_glClipPlanef = (PFNGLCLIPPLANEFPROC)(*load)("glClipPlanef");
      glad_glColor4f = (PFNGLCOLOR4FPROC)(*load)("glColor4f");
      glad_glDepthRangef = (PFNGLDEPTHRANGEFPROC)(*load)("glDepthRangef");
      glad_glFogf = (PFNGLFOGFPROC)(*load)("glFogf");
      glad_glFogfv = (PFNGLFOGFVPROC)(*load)("glFogfv");
      glad_glFrustumf = (PFNGLFRUSTUMFPROC)(*load)("glFrustumf");
      glad_glGetClipPlanef = (PFNGLGETCLIPPLANEFPROC)(*load)("glGetClipPlanef");
      glad_glGetFloatv = (PFNGLGETFLOATVPROC)(*load)("glGetFloatv");
      glad_glGetLightfv = (PFNGLGETLIGHTFVPROC)(*load)("glGetLightfv");
      glad_glGetMaterialfv = (PFNGLGETMATERIALFVPROC)(*load)("glGetMaterialfv");
      glad_glGetTexEnvfv = (PFNGLGETTEXENVFVPROC)(*load)("glGetTexEnvfv");
      glad_glGetTexParameterfv = (PFNGLGETTEXPARAMETERFVPROC)(*load)("glGetTexParameterfv");
      glad_glLightModelf = (PFNGLLIGHTMODELFPROC)(*load)("glLightModelf");
      glad_glLightModelfv = (PFNGLLIGHTMODELFVPROC)(*load)("glLightModelfv");
      glad_glLightf = (PFNGLLIGHTFPROC)(*load)("glLightf");
      glad_glLightfv = (PFNGLLIGHTFVPROC)(*load)("glLightfv");
      glad_glLineWidth = (PFNGLLINEWIDTHPROC)(*load)("glLineWidth");
      glad_glLoadMatrixf = (PFNGLLOADMATRIXFPROC)(*load)("glLoadMatrixf");
      glad_glMaterialf = (PFNGLMATERIALFPROC)(*load)("glMaterialf");
      glad_glMaterialfv = (PFNGLMATERIALFVPROC)(*load)("glMaterialfv");
      glad_glMultMatrixf = (PFNGLMULTMATRIXFPROC)(*load)("glMultMatrixf");
      glad_glMultiTexCoord4f = (PFNGLMULTITEXCOORD4FPROC)(*load)("glMultiTexCoord4f");
      glad_glNormal3f = (PFNGLNORMAL3FPROC)(*load)("glNormal3f");
      glad_glOrthof = (PFNGLORTHOFPROC)(*load)("glOrthof");
      glad_glPointParameterf = (PFNGLPOINTPARAMETERFPROC)(*load)("glPointParameterf");
      glad_glPointParameterfv = (PFNGLPOINTPARAMETERFVPROC)(*load)("glPointParameterfv");
      glad_glPointSize = (PFNGLPOINTSIZEPROC)(*load)("glPointSize");
      glad_glPolygonOffset = (PFNGLPOLYGONOFFSETPROC)(*load)("glPolygonOffset");
      glad_glRotatef = (PFNGLROTATEFPROC)(*load)("glRotatef");
      glad_glScalef = (PFNGLSCALEFPROC)(*load)("glScalef");
      glad_glTexEnvf = (PFNGLTEXENVFPROC)(*load)("glTexEnvf");
      glad_glTexEnvfv = (PFNGLTEXENVFVPROC)(*load)("glTexEnvfv");
      glad_glTexParameterf = (PFNGLTEXPARAMETERFPROC)(*load)("glTexParameterf");
      glad_glTexParameterfv = (PFNGLTEXPARAMETERFVPROC)(*load)("glTexParameterfv");
      glad_glTranslatef = (PFNGLTRANSLATEFPROC)(*load)("glTranslatef");
      glad_glActiveTexture = (PFNGLACTIVETEXTUREPROC)(*load)("glActiveTexture");
      glad_glAlphaFuncx = (PFNGLALPHAFUNCXPROC)(*load)("glAlphaFuncx");
      glad_glBindBuffer = (PFNGLBINDBUFFERPROC)(*load)("glBindBuffer");
      glad_glBindTexture = (PFNGLBINDTEXTUREPROC)(*load)("glBindTexture");
      glad_glBlendFunc = (PFNGLBLENDFUNCPROC)(*load)("glBlendFunc");
      glad_glBufferData = (PFNGLBUFFERDATAPROC)(*load)("glBufferData");
      glad_glBufferSubData = (PFNGLBUFFERSUBDATAPROC)(*load)("glBufferSubData");
      glad_glClear = (PFNGLCLEARPROC)(*load)("glClear");
      glad_glClearColorx = (PFNGLCLEARCOLORXPROC)(*load)("glClearColorx");
      glad_glClearDepthx = (PFNGLCLEARDEPTHXPROC)(*load)("glClearDepthx");
      glad_glClearStencil = (PFNGLCLEARSTENCILPROC)(*load)("glClearStencil");
      glad_glClientActiveTexture = (PFNGLCLIENTACTIVETEXTUREPROC)(*load)("glClientActiveTexture");
      glad_glClipPlanex = (PFNGLCLIPPLANEXPROC)(*load)("glClipPlanex");
      glad_glColor4ub = (PFNGLCOLOR4UBPROC)(*load)("glColor4ub");
      glad_glColor4x = (PFNGLCOLOR4XPROC)(*load)("glColor4x");
      glad_glColorMask = (PFNGLCOLORMASKPROC)(*load)("glColorMask");
      glad_glColorPointer = (PFNGLCOLORPOINTERPROC)(*load)("glColorPointer");
      glad_glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D")
      ;
      glad_glCompressedTexSubImage2D =
           (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D");
      glad_glCopyTexImage2D = (PFNGLCOPYTEXIMAGE2DPROC)(*load)("glCopyTexImage2D");
      glad_glCopyTexSubImage2D = (PFNGLCOPYTEXSUBIMAGE2DPROC)(*load)("glCopyTexSubImage2D");
      glad_glCullFace = (PFNGLCULLFACEPROC)(*load)("glCullFace");
      glad_glDeleteBuffers = (PFNGLDELETEBUFFERSPROC)(*load)("glDeleteBuffers");
      glad_glDeleteTextures = (PFNGLDELETETEXTURESPROC)(*load)("glDeleteTextures");
      glad_glDepthFunc = (PFNGLDEPTHFUNCPROC)(*load)("glDepthFunc");
      glad_glDepthMask = (PFNGLDEPTHMASKPROC)(*load)("glDepthMask");
      glad_glDepthRangex = (PFNGLDEPTHRANGEXPROC)(*load)("glDepthRangex");
      glad_glDisable = (PFNGLDISABLEPROC)(*load)("glDisable");
      glad_glDisableClientState = (PFNGLDISABLECLIENTSTATEPROC)(*load)("glDisableClientState");
      glad_glDrawArrays = (PFNGLDRAWARRAYSPROC)(*load)("glDrawArrays");
      glad_glDrawElements = (PFNGLDRAWELEMENTSPROC)(*load)("glDrawElements");
      glad_glEnable = (PFNGLENABLEPROC)(*load)("glEnable");
      glad_glEnableClientState = (PFNGLENABLECLIENTSTATEPROC)(*load)("glEnableClientState");
      glad_glFinish = (PFNGLFINISHPROC)(*load)("glFinish");
      glad_glFlush = (PFNGLFLUSHPROC)(*load)("glFlush");
      glad_glFogx = (PFNGLFOGXPROC)(*load)("glFogx");
      glad_glFogxv = (PFNGLFOGXVPROC)(*load)("glFogxv");
      glad_glFrontFace = (PFNGLFRONTFACEPROC)(*load)("glFrontFace");
      glad_glFrustumx = (PFNGLFRUSTUMXPROC)(*load)("glFrustumx");
      glad_glGetBooleanv = (PFNGLGETBOOLEANVPROC)(*load)("glGetBooleanv");
      glad_glGetBufferParameteriv = (PFNGLGETBUFFERPARAMETERIVPROC)(*load)("glGetBufferParameteriv")
      ;
      glad_glGetClipPlanex = (PFNGLGETCLIPPLANEXPROC)(*load)("glGetClipPlanex");
      glad_glGenBuffers = (PFNGLGENBUFFERSPROC)(*load)("glGenBuffers");
      glad_glGenTextures = (PFNGLGENTEXTURESPROC)(*load)("glGenTextures");
      glad_glGetError = (PFNGLGETERRORPROC)(*load)("glGetError");
      glad_glGetFixedv = (PFNGLGETFIXEDVPROC)(*load)("glGetFixedv");
      glad_glGetIntegerv = (PFNGLGETINTEGERVPROC)(*load)("glGetIntegerv");
      glad_glGetLightxv = (PFNGLGETLIGHTXVPROC)(*load)("glGetLightxv");
      glad_glGetMaterialxv = (PFNGLGETMATERIALXVPROC)(*load)("glGetMaterialxv");
      glad_glGetPointerv = (PFNGLGETPOINTERVPROC)(*load)("glGetPointerv");
      glad_glGetString = (PFNGLGETSTRINGPROC)(*load)("glGetString");
      glad_glGetTexEnviv = (PFNGLGETTEXENVIVPROC)(*load)("glGetTexEnviv");
      glad_glGetTexEnvxv = (PFNGLGETTEXENVXVPROC)(*load)("glGetTexEnvxv");
      glad_glGetTexParameteriv = (PFNGLGETTEXPARAMETERIVPROC)(*load)("glGetTexParameteriv");
      glad_glGetTexParameterxv = (PFNGLGETTEXPARAMETERXVPROC)(*load)("glGetTexParameterxv");
      glad_glHint = (PFNGLHINTPROC)(*load)("glHint");
      glad_glIsBuffer = (PFNGLISBUFFERPROC)(*load)("glIsBuffer");
      glad_glIsEnabled = (PFNGLISENABLEDPROC)(*load)("glIsEnabled");
      glad_glIsTexture = (PFNGLISTEXTUREPROC)(*load)("glIsTexture");
      glad_glLightModelx = (PFNGLLIGHTMODELXPROC)(*load)("glLightModelx");
      glad_glLightModelxv = (PFNGLLIGHTMODELXVPROC)(*load)("glLightModelxv");
      glad_glLightx = (PFNGLLIGHTXPROC)(*load)("glLightx");
      glad_glLightxv = (PFNGLLIGHTXVPROC)(*load)("glLightxv");
      glad_glLineWidthx = (PFNGLLINEWIDTHXPROC)(*load)("glLineWidthx");
      glad_glLoadIdentity = (PFNGLLOADIDENTITYPROC)(*load)("glLoadIdentity");
      glad_glLoadMatrixx = (PFNGLLOADMATRIXXPROC)(*load)("glLoadMatrixx");
      glad_glLogicOp = (PFNGLLOGICOPPROC)(*load)("glLogicOp");
      glad_glMaterialx = (PFNGLMATERIALXPROC)(*load)("glMaterialx");
      glad_glMaterialxv = (PFNGLMATERIALXVPROC)(*load)("glMaterialxv");
      glad_glMatrixMode = (PFNGLMATRIXMODEPROC)(*load)("glMatrixMode");
      glad_glMultMatrixx = (PFNGLMULTMATRIXXPROC)(*load)("glMultMatrixx");
      glad_glMultiTexCoord4x = (PFNGLMULTITEXCOORD4XPROC)(*load)("glMultiTexCoord4x");
      glad_glNormal3x = (PFNGLNORMAL3XPROC)(*load)("glNormal3x");
      glad_glNormalPointer = (PFNGLNORMALPOINTERPROC)(*load)("glNormalPointer");
      glad_glOrthox = (PFNGLORTHOXPROC)(*load)("glOrthox");
      glad_glPixelStorei = (PFNGLPIXELSTOREIPROC)(*load)("glPixelStorei");
      glad_glPointParameterx = (PFNGLPOINTPARAMETERXPROC)(*load)("glPointParameterx");
      glad_glPointParameterxv = (PFNGLPOINTPARAMETERXVPROC)(*load)("glPointParameterxv");
      glad_glPointSizex = (PFNGLPOINTSIZEXPROC)(*load)("glPointSizex");
      glad_glPolygonOffsetx = (PFNGLPOLYGONOFFSETXPROC)(*load)("glPolygonOffsetx");
      glad_glPopMatrix = (PFNGLPOPMATRIXPROC)(*load)("glPopMatrix");
      glad_glPushMatrix = (PFNGLPUSHMATRIXPROC)(*load)("glPushMatrix");
      glad_glReadPixels = (PFNGLREADPIXELSPROC)(*load)("glReadPixels");
      glad_glRotatex = (PFNGLROTATEXPROC)(*load)("glRotatex");
      glad_glSampleCoverage = (PFNGLSAMPLECOVERAGEPROC)(*load)("glSampleCoverage");
      glad_glSampleCoveragex = (PFNGLSAMPLECOVERAGEXPROC)(*load)("glSampleCoveragex");
      glad_glScalex = (PFNGLSCALEXPROC)(*load)("glScalex");
      glad_glScissor = (PFNGLSCISSORPROC)(*load)("glScissor");
      glad_glShadeModel = (PFNGLSHADEMODELPROC)(*load)("glShadeModel");
      glad_glStencilFunc = (PFNGLSTENCILFUNCPROC)(*load)("glStencilFunc");
      glad_glStencilMask = (PFNGLSTENCILMASKPROC)(*load)("glStencilMask");
      glad_glStencilOp = (PFNGLSTENCILOPPROC)(*load)("glStencilOp");
      glad_glTexCoordPointer = (PFNGLTEXCOORDPOINTERPROC)(*load)("glTexCoordPointer");
      glad_glTexEnvi = (PFNGLTEXENVIPROC)(*load)("glTexEnvi");
      glad_glTexEnvx = (PFNGLTEXENVXPROC)(*load)("glTexEnvx");
      glad_glTexEnviv = (PFNGLTEXENVIVPROC)(*load)("glTexEnviv");
      glad_glTexEnvxv = (PFNGLTEXENVXVPROC)(*load)("glTexEnvxv");
      glad_glTexImage2D = (PFNGLTEXIMAGE2DPROC)(*load)("glTexImage2D");
      glad_glTexParameteri = (PFNGLTEXPARAMETERIPROC)(*load)("glTexParameteri");
      glad_glTexParameterx = (PFNGLTEXPARAMETERXPROC)(*load)("glTexParameterx");
      glad_glTexParameteriv = (PFNGLTEXPARAMETERIVPROC)(*load)("glTexParameteriv");
      glad_glTexParameterxv = (PFNGLTEXPARAMETERXVPROC)(*load)("glTexParameterxv");
      glad_glTexSubImage2D = (PFNGLTEXSUBIMAGE2DPROC)(*load)("glTexSubImage2D");
      glad_glTranslatex = (PFNGLTRANSLATEXPROC)(*load)("glTranslatex");
      glad_glVertexPointer = (PFNGLVERTEXPOINTERPROC)(*load)("glVertexPointer");
      glad_glViewport = (PFNGLVIEWPORTPROC)(*load)("glViewport");
    }
    get_exts();
    GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
    GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
    GLAD_GL_NV_fence = has_ext("GL_NV_fence");
    GLAD_GL_OES_single_precision = has_ext("GL_OES_single_precision");
    GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
    GLAD_GL_OES_byte_coordinates = has_ext("GL_OES_byte_coordinates");
    GLAD_GL_OES_query_matrix = has_ext("GL_OES_query_matrix");
    GLAD_GL_OES_read_format = has_ext("GL_OES_read_format");
    GLAD_GL_EXT_texture_lod_bias = has_ext("GL_EXT_texture_lod_bias");
    GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
    GLAD_GL_OES_fixed_point = has_ext("GL_OES_fixed_point");
    GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
    GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
    GLAD_GL_NV_fence = has_ext("GL_NV_fence");
    GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
    GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
    GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
    GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
    GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
    GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
    GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture =
         has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
    GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
    GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
    GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
    GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
    GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
    GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
    GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
    GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
    GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
    GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
    GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
    GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
    GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
    GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
    GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
    GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
    GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
    GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
    GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
    GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
    GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
    GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
    GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
    GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
    GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
    GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
    GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
    GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
    GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
    GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
    GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
    GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
    GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
    GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
    GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
    GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
    GLAD_GL_OES_texture_mirrored_repeat = has_ext("GL_OES_texture_mirrored_repeat");
    GLAD_GL_EXT_multi_draw_arrays = has_ext("GL_EXT_multi_draw_arrays");
    GLAD_GL_AMD_compressed_3DC_texture = has_ext("GL_AMD_compressed_3DC_texture");
    GLAD_GL_EXT_texture_compression_dxt1 = has_ext("GL_EXT_texture_compression_dxt1");
    GLAD_GL_OES_single_precision = has_ext("GL_OES_single_precision");
    GLAD_GL_OES_point_size_array = has_ext("GL_OES_point_size_array");
    GLAD_GL_OES_element_index_uint = has_ext("GL_OES_element_index_uint");
    GLAD_GL_OES_texture_cube_map = has_ext("GL_OES_texture_cube_map");
    GLAD_GL_IMG_user_clip_plane = has_ext("GL_IMG_user_clip_plane");
    GLAD_GL_NV_fence = has_ext("GL_NV_fence");
    GLAD_GL_EXT_map_buffer_range = has_ext("GL_EXT_map_buffer_range");
    GLAD_GL_OES_blend_subtract = has_ext("GL_OES_blend_subtract");
    GLAD_GL_EXT_read_format_bgra = has_ext("GL_EXT_read_format_bgra");
    GLAD_GL_OES_read_format = has_ext("GL_OES_read_format");
    GLAD_GL_OES_compressed_ETC1_RGB8_texture = has_ext("GL_OES_compressed_ETC1_RGB8_texture");
    GLAD_GL_QCOM_extended_get2 = has_ext("GL_QCOM_extended_get2");
    GLAD_GL_OES_EGL_image_external = has_ext("GL_OES_EGL_image_external");
    GLAD_GL_OES_required_internalformat = has_ext("GL_OES_required_internalformat");
    GLAD_GL_OES_extended_matrix_palette = has_ext("GL_OES_extended_matrix_palette");
    GLAD_GL_APPLE_texture_max_level = has_ext("GL_APPLE_texture_max_level");
    GLAD_GL_EXT_multisampled_render_to_texture = has_ext("GL_EXT_multisampled_render_to_texture");
    GLAD_GL_QCOM_writeonly_rendering = has_ext("GL_QCOM_writeonly_rendering");
    GLAD_GL_OES_packed_depth_stencil = has_ext("GL_OES_packed_depth_stencil");
    GLAD_GL_IMG_texture_env_enhanced_fixed_function =
         has_ext("GL_IMG_texture_env_enhanced_fixed_function");
    GLAD_GL_APPLE_texture_format_BGRA8888 = has_ext("GL_APPLE_texture_format_BGRA8888");
    GLAD_GL_EXT_discard_framebuffer = has_ext("GL_EXT_discard_framebuffer");
    GLAD_GL_OES_fixed_point = has_ext("GL_OES_fixed_point");
    GLAD_GL_QCOM_perfmon_global_mode = has_ext("GL_QCOM_perfmon_global_mode");
    GLAD_GL_OES_matrix_palette = has_ext("GL_OES_matrix_palette");
    GLAD_GL_OES_mapbuffer = has_ext("GL_OES_mapbuffer");
    GLAD_GL_IMG_multisampled_render_to_texture = has_ext("GL_IMG_multisampled_render_to_texture");
    GLAD_GL_OES_depth32 = has_ext("GL_OES_depth32");
    GLAD_GL_APPLE_framebuffer_multisample = has_ext("GL_APPLE_framebuffer_multisample");
    GLAD_GL_APPLE_copy_texture_levels = has_ext("GL_APPLE_copy_texture_levels");
    GLAD_GL_EXT_texture_format_BGRA8888 = has_ext("GL_EXT_texture_format_BGRA8888");
    GLAD_GL_APPLE_texture_2D_limited_npot = has_ext("GL_APPLE_texture_2D_limited_npot");
    GLAD_GL_OES_EGL_image = has_ext("GL_OES_EGL_image");
    GLAD_GL_QCOM_extended_get = has_ext("GL_QCOM_extended_get");
    GLAD_GL_OES_query_matrix = has_ext("GL_OES_query_matrix");
    GLAD_GL_OES_point_sprite = has_ext("GL_OES_point_sprite");
    GLAD_GL_QCOM_tiled_rendering = has_ext("GL_QCOM_tiled_rendering");
    GLAD_GL_OES_stencil8 = has_ext("GL_OES_stencil8");
    GLAD_GL_OES_blend_equation_separate = has_ext("GL_OES_blend_equation_separate");
    GLAD_GL_OES_stencil4 = has_ext("GL_OES_stencil4");
    GLAD_GL_OES_framebuffer_object = has_ext("GL_OES_framebuffer_object");
    GLAD_GL_OES_stencil1 = has_ext("GL_OES_stencil1");
    GLAD_GL_ARM_rgba8 = has_ext("GL_ARM_rgba8");
    GLAD_GL_EXT_robustness = has_ext("GL_EXT_robustness");
    GLAD_GL_EXT_sRGB = has_ext("GL_EXT_sRGB");
    GLAD_GL_EXT_texture_lod_bias = has_ext("GL_EXT_texture_lod_bias");
    GLAD_GL_OES_compressed_ETC1_RGB8_sub_texture =
         has_ext("GL_OES_compressed_ETC1_RGB8_sub_texture");
    GLAD_GL_OES_draw_texture = has_ext("GL_OES_draw_texture");
    GLAD_GL_OES_blend_func_separate = has_ext("GL_OES_blend_func_separate");
    GLAD_GL_OES_texture_env_crossbar = has_ext("GL_OES_texture_env_crossbar");
    GLAD_GL_OES_rgb8_rgba8 = has_ext("GL_OES_rgb8_rgba8");
    GLAD_GL_OES_fbo_render_mipmap = has_ext("GL_OES_fbo_render_mipmap");
    GLAD_GL_OES_compressed_paletted_texture = has_ext("GL_OES_compressed_paletted_texture");
    GLAD_GL_OES_vertex_array_object = has_ext("GL_OES_vertex_array_object");
    GLAD_GL_OES_matrix_get = has_ext("GL_OES_matrix_get");
    GLAD_GL_EXT_texture_filter_anisotropic = has_ext("GL_EXT_texture_filter_anisotropic");
    GLAD_GL_EXT_blend_minmax = has_ext("GL_EXT_blend_minmax");
    GLAD_GL_OES_byte_coordinates = has_ext("GL_OES_byte_coordinates");
    GLAD_GL_IMG_read_format = has_ext("GL_IMG_read_format");
    GLAD_GL_OES_depth24 = has_ext("GL_OES_depth24");
    GLAD_GL_OES_stencil_wrap = has_ext("GL_OES_stencil_wrap");
    GLAD_GL_APPLE_sync = has_ext("GL_APPLE_sync");
    GLAD_GL_EXT_texture_storage = has_ext("GL_EXT_texture_storage");
    GLAD_GL_AMD_compressed_ATC_texture = has_ext("GL_AMD_compressed_ATC_texture");
    GLAD_GL_QCOM_driver_control = has_ext("GL_QCOM_driver_control");
    GLAD_GL_IMG_texture_compression_pvrtc = has_ext("GL_IMG_texture_compression_pvrtc");
    load_GL_EXT_multi_draw_arrays(load);
    load_GL_NV_fence(load);
    load_GL_OES_single_precision(load);
    if (GLAD_GL_EXT_blend_minmax != 0) {
      glad_glBlendEquationEXT = (PFNGLBLENDEQUATIONEXTPROC)(*load)("glBlendEquationEXT");
    }
    load_GL_OES_byte_coordinates(load);
    if (GLAD_GL_OES_query_matrix != 0) {
      glad_glQueryMatrixxOES = (PFNGLQUERYMATRIXXOESPROC)(*load)("glQueryMatrixxOES");
    }
    load_GL_OES_fixed_point(load);
    load_GL_NV_fence(load);
    load_GL_OES_vertex_array_object(load);
    load_GL_QCOM_tiled_rendering(load);
    load_GL_EXT_robustness(load);
    load_GL_EXT_multi_draw_arrays(load);
    load_GL_QCOM_driver_control(load);
    load_GL_EXT_multisampled_render_to_texture(load);
    load_GL_APPLE_framebuffer_multisample(load);
    load_GL_APPLE_sync(load);
    load_GL_QCOM_extended_get2(load);
    load_GL_OES_EGL_image(load);
    if (GLAD_GL_EXT_blend_minmax != 0) {
      glad_glBlendEquationEXT = (PFNGLBLENDEQUATIONEXTPROC)(*load)("glBlendEquationEXT");
    }
    load_GL_EXT_texture_storage(load);
    load_GL_EXT_map_buffer_range(load);
    load_GL_OES_mapbuffer(load);
    load_GL_IMG_multisampled_render_to_texture(load);
    if (GLAD_GL_APPLE_copy_texture_levels != 0) {
      glad_glCopyTextureLevelsAPPLE =
           (PFNGLCOPYTEXTURELEVELSAPPLEPROC)(*load)("glCopyTextureLevelsAPPLE");
    }
    load_GL_QCOM_extended_get(load);
    if (GLAD_GL_EXT_discard_framebuffer != 0) {
      glad_glDiscardFramebufferEXT =
           (PFNGLDISCARDFRAMEBUFFEREXTPROC)(*load)("glDiscardFramebufferEXT");
    }
    load_GL_EXT_multi_draw_arrays(load);
    load_GL_OES_single_precision(load);
    if (GLAD_GL_OES_point_size_array != 0) {
      glad_glPointSizePointerOES = (PFNGLPOINTSIZEPOINTEROESPROC)(*load)("glPointSizePointerOES");
    }
    if (GLAD_GL_OES_texture_cube_map != 0) {
      glad_glTexGenfOES = (PFNGLTEXGENFOESPROC)(*load)("glTexGenfOES");
      glad_glTexGenfvOES = (PFNGLTEXGENFVOESPROC)(*load)("glTexGenfvOES");
      glad_glTexGeniOES = (PFNGLTEXGENIOESPROC)(*load)("glTexGeniOES");
      glad_glTexGenivOES = (PFNGLTEXGENIVOESPROC)(*load)("glTexGenivOES");
      glad_glTexGenxOES = (PFNGLTEXGENXOESPROC)(*load)("glTexGenxOES");
      glad_glTexGenxvOES = (PFNGLTEXGENXVOESPROC)(*load)("glTexGenxvOES");
      glad_glGetTexGenfvOES = (PFNGLGETTEXGENFVOESPROC)(*load)("glGetTexGenfvOES");
      glad_glGetTexGenivOES = (PFNGLGETTEXGENIVOESPROC)(*load)("glGetTexGenivOES");
      glad_glGetTexGenxvOES = (PFNGLGETTEXGENXVOESPROC)(*load)("glGetTexGenxvOES");
    }
    if (GLAD_GL_IMG_user_clip_plane != 0) {
      glad_glClipPlanefIMG = (PFNGLCLIPPLANEFIMGPROC)(*load)("glClipPlanefIMG");
      glad_glClipPlanexIMG = (PFNGLCLIPPLANEXIMGPROC)(*load)("glClipPlanexIMG");
    }
    load_GL_NV_fence(load);
    load_GL_EXT_map_buffer_range(load);
    if (GLAD_GL_OES_blend_subtract != 0) {
      glad_glBlendEquationOES = (PFNGLBLENDEQUATIONOESPROC)(*load)("glBlendEquationOES");
    }
    load_GL_QCOM_extended_get2(load);
    load_GL_EXT_multisampled_render_to_texture(load);
    if (GLAD_GL_EXT_discard_framebuffer != 0) {
      glad_glDiscardFramebufferEXT =
           (PFNGLDISCARDFRAMEBUFFEREXTPROC)(*load)("glDiscardFramebufferEXT");
    }
    load_GL_OES_fixed_point(load);
    if (GLAD_GL_OES_matrix_palette != 0) {
      glad_glCurrentPaletteMatrixOES =
           (PFNGLCURRENTPALETTEMATRIXOESPROC)(*load)("glCurrentPaletteMatrixOES");
      glad_glLoadPaletteFromModelViewMatrixOES =
           (PFNGLLOADPALETTEFROMMODELVIEWMATRIXOESPROC)
           (*load)("glLoadPaletteFromModelViewMatrixOES");
      glad_glMatrixIndexPointerOES =
           (PFNGLMATRIXINDEXPOINTEROESPROC)(*load)("glMatrixIndexPointerOES");
      glad_glWeightPointerOES = (PFNGLWEIGHTPOINTEROESPROC)(*load)("glWeightPointerOES");
    }
    load_GL_OES_mapbuffer(load);
    load_GL_IMG_multisampled_render_to_texture(load);
    load_GL_APPLE_framebuffer_multisample(load);
    if (GLAD_GL_APPLE_copy_texture_levels != 0) {
      glad_glCopyTextureLevelsAPPLE =
           (PFNGLCOPYTEXTURELEVELSAPPLEPROC)(*load)("glCopyTextureLevelsAPPLE");
    }
    load_GL_OES_EGL_image(load);
    load_GL_QCOM_extended_get(load);
    if (GLAD_GL_OES_query_matrix != 0) {
      glad_glQueryMatrixxOES = (PFNGLQUERYMATRIXXOESPROC)(*load)("glQueryMatrixxOES");
    }
    load_GL_QCOM_tiled_rendering(load);
    if (GLAD_GL_OES_blend_equation_separate != 0) {
      glad_glBlendEquationSeparateOES =
           (PFNGLBLENDEQUATIONSEPARATEOESPROC)(*load)("glBlendEquationSeparateOES");
    }
    if (GLAD_GL_OES_framebuffer_object != 0) {
      glad_glIsRenderbufferOES = (PFNGLISRENDERBUFFEROESPROC)(*load)("glIsRenderbufferOES");
      glad_glBindRenderbufferOES = (PFNGLBINDRENDERBUFFEROESPROC)(*load)("glBindRenderbufferOES");
      glad_glDeleteRenderbuffersOES =
           (PFNGLDELETERENDERBUFFERSOESPROC)(*load)("glDeleteRenderbuffersOES");
      glad_glGenRenderbuffersOES = (PFNGLGENRENDERBUFFERSOESPROC)(*load)("glGenRenderbuffersOES");
      glad_glRenderbufferStorageOES =
           (PFNGLRENDERBUFFERSTORAGEOESPROC)(*load)("glRenderbufferStorageOES");
      glad_glGetRenderbufferParameterivOES =
           (PFNGLGETRENDERBUFFERPARAMETERIVOESPROC)(*load)("glGetRenderbufferParameterivOES");
      glad_glIsFramebufferOES = (PFNGLISFRAMEBUFFEROESPROC)(*load)("glIsFramebufferOES");
      glad_glBindFramebufferOES = (PFNGLBINDFRAMEBUFFEROESPROC)(*load)("glBindFramebufferOES");
      glad_glDeleteFramebuffersOES =
           (PFNGLDELETEFRAMEBUFFERSOESPROC)(*load)("glDeleteFramebuffersOES");
      glad_glGenFramebuffersOES = (PFNGLGENFRAMEBUFFERSOESPROC)(*load)("glGenFramebuffersOES");
      glad_glCheckFramebufferStatusOES =
           (PFNGLCHECKFRAMEBUFFERSTATUSOESPROC)(*load)("glCheckFramebufferStatusOES");
      glad_glFramebufferRenderbufferOES =
           (PFNGLFRAMEBUFFERRENDERBUFFEROESPROC)(*load)("glFramebufferRenderbufferOES");
      glad_glFramebufferTexture2DOES =
           (PFNGLFRAMEBUFFERTEXTURE2DOESPROC)(*load)("glFramebufferTexture2DOES");
      glad_glGetFramebufferAttachmentParameterivOES =
           (PFNGLGETFRAMEBUFFERATTACHMENTPARAMETERIVOESPROC)
           (*load)("glGetFramebufferAttachmentParameterivOES");
      glad_glGenerateMipmapOES = (PFNGLGENERATEMIPMAPOESPROC)(*load)("glGenerateMipmapOES");
    }
    load_GL_EXT_robustness(load);
    if (GLAD_GL_OES_draw_texture != 0) {
      glad_glDrawTexsOES = (PFNGLDRAWTEXSOESPROC)(*load)("glDrawTexsOES");
      glad_glDrawTexiOES = (PFNGLDRAWTEXIOESPROC)(*load)("glDrawTexiOES");
      glad_glDrawTexxOES = (PFNGLDRAWTEXXOESPROC)(*load)("glDrawTexxOES");
      glad_glDrawTexsvOES = (PFNGLDRAWTEXSVOESPROC)(*load)("glDrawTexsvOES");
      glad_glDrawTexivOES = (PFNGLDRAWTEXIVOESPROC)(*load)("glDrawTexivOES");
      glad_glDrawTexxvOES = (PFNGLDRAWTEXXVOESPROC)(*load)("glDrawTexxvOES");
      glad_glDrawTexfOES = (PFNGLDRAWTEXFOESPROC)(*load)("glDrawTexfOES");
      glad_glDrawTexfvOES = (PFNGLDRAWTEXFVOESPROC)(*load)("glDrawTexfvOES");
    }
    if (GLAD_GL_OES_blend_func_separate != 0) {
      glad_glBlendFuncSeparateOES = (PFNGLBLENDFUNCSEPARATEOESPROC)(*load)("glBlendFuncSeparateOES")
      ;
    }
    load_GL_OES_vertex_array_object(load);
    if (GLAD_GL_EXT_blend_minmax != 0) {
      glad_glBlendEquationEXT = (PFNGLBLENDEQUATIONEXTPROC)(*load)("glBlendEquationEXT");
    }
    load_GL_OES_byte_coordinates(load);
    load_GL_APPLE_sync(load);
    load_GL_EXT_texture_storage(load);
    load_GL_QCOM_driver_control(load);
    uVar3 = (uint)(GLVersion.minor != 0 || GLVersion.major != 0);
  }
  return uVar3;
}

Assistant:

int gladLoadGLES1Loader(GLADloadproc load) {
	GLVersion.major = 0; GLVersion.minor = 0;
	glGetString = (PFNGLGETSTRINGPROC)load("glGetString");
	if(glGetString == NULL) return 0;
	if(glGetString(GL_VERSION) == NULL) return 0;
	find_coreGLES1();
	load_GL_VERSION_ES_CM_1_0(load);

	find_extensionsGLES1();
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_NV_fence(load);
	load_GL_OES_single_precision(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_OES_byte_coordinates(load);
	load_GL_OES_query_matrix(load);
	load_GL_OES_fixed_point(load);
	load_GL_NV_fence(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_QCOM_tiled_rendering(load);
	load_GL_EXT_robustness(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_QCOM_driver_control(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_APPLE_sync(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_OES_EGL_image(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_EXT_texture_storage(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_OES_mapbuffer(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_QCOM_extended_get(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_EXT_multi_draw_arrays(load);
	load_GL_OES_single_precision(load);
	load_GL_OES_point_size_array(load);
	load_GL_OES_texture_cube_map(load);
	load_GL_IMG_user_clip_plane(load);
	load_GL_NV_fence(load);
	load_GL_EXT_map_buffer_range(load);
	load_GL_OES_blend_subtract(load);
	load_GL_QCOM_extended_get2(load);
	load_GL_EXT_multisampled_render_to_texture(load);
	load_GL_EXT_discard_framebuffer(load);
	load_GL_OES_fixed_point(load);
	load_GL_OES_matrix_palette(load);
	load_GL_OES_mapbuffer(load);
	load_GL_IMG_multisampled_render_to_texture(load);
	load_GL_APPLE_framebuffer_multisample(load);
	load_GL_APPLE_copy_texture_levels(load);
	load_GL_OES_EGL_image(load);
	load_GL_QCOM_extended_get(load);
	load_GL_OES_query_matrix(load);
	load_GL_QCOM_tiled_rendering(load);
	load_GL_OES_blend_equation_separate(load);
	load_GL_OES_framebuffer_object(load);
	load_GL_EXT_robustness(load);
	load_GL_OES_draw_texture(load);
	load_GL_OES_blend_func_separate(load);
	load_GL_OES_vertex_array_object(load);
	load_GL_EXT_blend_minmax(load);
	load_GL_OES_byte_coordinates(load);
	load_GL_APPLE_sync(load);
	load_GL_EXT_texture_storage(load);
	load_GL_QCOM_driver_control(load);
	return GLVersion.major != 0 || GLVersion.minor != 0;
}